

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::Copy(aiMeshMorphAnim **_dest,aiMeshMorphAnim *src)

{
  aiMeshMorphKey **dest;
  aiMeshMorphKey *paVar1;
  aiMeshMorphAnim *__dest;
  void *pvVar2;
  long lVar3;
  ai_uint i;
  ulong uVar4;
  
  if (src != (aiMeshMorphAnim *)0x0 && _dest != (aiMeshMorphAnim **)0x0) {
    __dest = (aiMeshMorphAnim *)operator_new(0x410);
    dest = &__dest->mKeys;
    *_dest = __dest;
    memcpy(__dest,src,0x410);
    GetArrayCopy<aiMeshMorphKey>(dest,__dest->mNumKeys);
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < __dest->mNumKeys; uVar4 = uVar4 + 1) {
      paVar1 = *dest;
      pvVar2 = operator_new__((ulong)*(uint *)((long)&paVar1->mNumValuesAndWeights + lVar3) << 2);
      *(void **)((long)&paVar1->mValues + lVar3) = pvVar2;
      paVar1 = *dest;
      pvVar2 = operator_new__((ulong)*(uint *)((long)&paVar1->mNumValuesAndWeights + lVar3) << 3);
      *(void **)((long)&paVar1->mWeights + lVar3) = pvVar2;
      memcpy(*(void **)((long)&(*dest)->mValues + lVar3),
             *(void **)((long)&src->mKeys->mValues + lVar3),
             (ulong)*(uint *)((long)&(*dest)->mNumValuesAndWeights + lVar3) << 2);
      memcpy(*(void **)((long)&(*dest)->mWeights + lVar3),
             *(void **)((long)&src->mKeys->mWeights + lVar3),
             (ulong)*(uint *)((long)&(*dest)->mNumValuesAndWeights + lVar3) << 3);
      lVar3 = lVar3 + 0x20;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMeshMorphAnim** _dest, const aiMeshMorphAnim* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMeshMorphAnim* dest = *_dest = new aiMeshMorphAnim();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMeshMorphAnim));

    // and reallocate all arrays
    GetArrayCopy( dest->mKeys, dest->mNumKeys );
    for (ai_uint i = 0; i < dest->mNumKeys;++i) {
        dest->mKeys[i].mValues = new unsigned int[dest->mKeys[i].mNumValuesAndWeights];
        dest->mKeys[i].mWeights = new double[dest->mKeys[i].mNumValuesAndWeights];
        ::memcpy(dest->mKeys[i].mValues, src->mKeys[i].mValues, dest->mKeys[i].mNumValuesAndWeights * sizeof(unsigned int));
        ::memcpy(dest->mKeys[i].mWeights, src->mKeys[i].mWeights, dest->mKeys[i].mNumValuesAndWeights * sizeof(double));
    }
}